

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
interfaces::MakeSignalHandler(interfaces *this,connection connection)

{
  _func_int **pp_Var1;
  element_type *peVar2;
  undefined8 *puVar3;
  element_type *peVar4;
  long in_FS_OFFSET;
  weak_count awStack_50 [2];
  undefined8 local_40;
  weak_count wStack_38;
  long local_30;
  
  peVar4 = connection._weak_connection_body.px;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = (undefined8 *)operator_new(0x18);
  local_40 = 0;
  pp_Var1 = peVar4->_vptr_connection_body_base;
  peVar2 = (peVar4->_weak_blocker).px;
  peVar4->_vptr_connection_body_base = (_func_int **)0x0;
  (peVar4->_weak_blocker).px = (element_type *)0x0;
  wStack_38.pi_ = (sp_counted_base *)0x0;
  boost::detail::weak_count::~weak_count(&wStack_38);
  *puVar3 = &PTR__SignalHandler_006be990;
  puVar3[1] = pp_Var1;
  puVar3[2] = peVar2;
  local_40 = 0;
  wStack_38.pi_ = (sp_counted_base *)0x0;
  awStack_50[0].pi_ = (sp_counted_base *)0x0;
  boost::detail::weak_count::~weak_count(&wStack_38);
  boost::detail::weak_count::~weak_count(awStack_50);
  *(undefined8 **)this = puVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> MakeSignalHandler(boost::signals2::connection connection)
{
    return std::make_unique<common::SignalHandler>(std::move(connection));
}